

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::initialVelocityProject
          (Projection *this,int c_lev,Real cur_divu_time,int have_divu,int init_vel_iter)

{
  IntVect *pIVar1;
  int f_lev;
  pointer ppAVar2;
  AmrLevel *pAVar3;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar4;
  FabArrayBase *pFVar5;
  uint nghost;
  pointer puVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  MultiFab *pMVar11;
  NavierStokesBase *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  undefined8 uVar13;
  MultiFab *pMVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  Real RVar19;
  allocator local_291;
  Real local_290;
  int local_284;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  sig;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  int Divu;
  undefined8 uStack_240;
  undefined8 local_238;
  int Divu_Type;
  undefined8 uStack_220;
  undefined8 local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  MFIter mfi;
  
  f_lev = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  lVar15 = (long)f_lev;
  if (init_vel_iter < 1) {
    for (lVar10 = (long)c_lev; lVar10 <= lVar15; lVar10 = lVar10 + 1) {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (*(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar10]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x1b0),0.0);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (*(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar10]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x290),0.0);
    }
    if (verbose != 0) {
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&mfi,poVar9);
      std::operator<<((ostream *)&mfi.tile_size,
                      "Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n"
                     );
      amrex::Print::~Print((Print *)&mfi);
    }
  }
  else {
    if (verbose != 0) {
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&mfi,poVar9);
      pIVar1 = &mfi.tile_size;
      std::operator<<((ostream *)pIVar1,"Projection::initialVelocityProject(): levels = ");
      std::ostream::operator<<(pIVar1,c_lev);
      std::operator<<((ostream *)pIVar1,"-");
      std::ostream::operator<<(pIVar1,f_lev);
      std::operator<<((ostream *)pIVar1,'\n');
      amrex::Print::~Print((Print *)&mfi);
      if (rho_wgt_vel_proj == 0) {
        poVar9 = amrex::OutStream();
        amrex::Print::Print((Print *)&mfi,poVar9);
        std::operator<<((ostream *)&mfi.tile_size,"CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n");
      }
      else {
        poVar9 = amrex::OutStream();
        amrex::Print::Print((Print *)&mfi,poVar9);
        std::operator<<((ostream *)&mfi.tile_size,"RHO WEIGHTED INITIAL VELOCITY PROJECTION\n");
      }
      amrex::Print::~Print((Print *)&mfi);
      if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
        amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
      }
    }
    dVar18 = amrex::ParallelDescriptor::second();
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              (&vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
               (value_type *)&mfi,(allocator_type *)&phi);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              (&phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
               (value_type *)&mfi,(allocator_type *)&sig);
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::vector(&sig.
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ,10,(allocator_type *)&mfi);
    lVar10 = (long)c_lev;
    local_284 = (f_lev - c_lev) + 1;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while (local_208._M_pi = p_Var12, (int)p_Var12 != init_vel_iter) {
      lVar16 = lVar10;
      if (verbose != 0) {
        poVar9 = amrex::OutStream();
        amrex::Print::Print((Print *)&mfi,poVar9);
        pIVar1 = &mfi.tile_size;
        std::endl<char,std::char_traits<char>>((ostream *)pIVar1);
        std::operator<<((ostream *)pIVar1,"Projection::initialVelocityProject(): iteration ");
        std::ostream::operator<<(pIVar1,(int)local_208._M_pi);
        std::endl<char,std::char_traits<char>>((ostream *)pIVar1);
        amrex::Print::~Print((Print *)&mfi);
      }
      for (; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar16]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1b0),0.0);
      }
      bVar7 = OutFlowBC::HasOutFlowBC(this->phys_bc);
      bVar7 = (have_divu != 0 && bVar7) && do_outflow_bcs != 0;
      uVar13 = CONCAT71((int7)((ulong)p_Var12 >> 8),bVar7);
      nghost = (uint)bVar7;
      for (lVar16 = lVar10;
          puVar6 = sig.
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, lVar16 <= lVar15; lVar16 = lVar16 + 1)
      {
        vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar16] =
             *(MultiFab **)
              (*(long *)&((this->LevelData).
                          super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar16]->state).
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
              200);
        phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar16] =
             *(MultiFab **)
              (*(long *)&((this->LevelData).
                          super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar16]->state).
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
              0x1b0);
        ppAVar2 = (this->LevelData).
                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pAVar3 = ppAVar2[lVar16];
        pMVar11 = (MultiFab *)operator_new(0x180);
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        mfi.tile_size.vect[2] = 0;
        mfi.flags = '\0';
        mfi._29_3_ = 0;
        mfi.currentIndex = 0;
        mfi.beginIndex = 0;
        mfi.fabArray = (FabArrayBase *)0x0;
        mfi.tile_size.vect[0] = 0;
        mfi.tile_size.vect[1] = 0;
        uVar13 = 0;
        amrex::MultiFab::MultiFab
                  (pMVar11,&pAVar3->grids,&pAVar3->dmap,1,nghost,(MFInfo *)&mfi,
                   (FabFactory<amrex::FArrayBox> *)
                   (ppAVar2[lVar16]->m_factory)._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  );
        pMVar14 = puVar6[lVar16]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        puVar6[lVar16]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar11;
        if (pMVar14 != (MultiFab *)0x0) {
          (**(code **)(*(long *)&(pMVar14->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
          )();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfi.tile_size);
        if (rho_wgt_vel_proj == 0) {
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (&(sig.
                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>,1.0,nghost);
        }
        else {
          if (nghost != 0) {
            amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                      (*(FabArray<amrex::FArrayBox> **)
                        (*(long *)&((this->LevelData).
                                    super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                    .
                                    super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar16]->state).
                                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                   .
                                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                        + 200),1e+200,3,1);
            uVar4._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
            ._M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                 (this->parent->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t;
            pFVar5 = (FabArrayBase *)
                     ((*(StateData **)
                        ((long)uVar4._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170
                        ))->new_data)._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
            local_290 = amrex::StateData::curTime
                                  (*(StateData **)
                                    ((long)uVar4._M_t.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                           _M_head_impl + 0x170));
            amrex::MFIter::MFIter(&mfi,pFVar5,'\0');
            while (mfi.currentIndex < mfi.endIndex) {
              iVar8 = mfi.currentIndex;
              if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                iVar8 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[mfi.currentIndex];
              }
              (**(code **)(*(long *)uVar4._M_t.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0xf0))(local_290,
                                 uVar4._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                                 *(undefined8 *)
                                  (*(long *)((long)(pFVar5 + 1) + 0x18) + (long)iVar8 * 8),0,3,3,1);
              amrex::MFIter::operator++(&mfi);
            }
            amrex::MFIter::~MFIter(&mfi);
          }
          uVar13 = 0;
          amrex::MultiFab::Copy
                    (sig.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     *(MultiFab **)
                      (*(long *)&((this->LevelData).
                                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  .
                                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar16]->state).
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 200),3,0,1,nghost);
        }
      }
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::vector(&rhcc.
                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ,10,(allocator_type *)&mfi);
      for (lVar16 = lVar10; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
        amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                  (&vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar16]->
                    super_FabArray<amrex::FArrayBox>,1e+200,0,3);
        uVar4._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
        _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->parent->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t;
        pFVar5 = (FabArrayBase *)
                 ((*(StateData **)
                    ((long)uVar4._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170))->
                 new_data)._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        local_290 = amrex::StateData::curTime
                              (*(StateData **)
                                ((long)uVar4._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                                + 0x170));
        amrex::MFIter::MFIter(&mfi,pFVar5,'\0');
        while (mfi.currentIndex < mfi.endIndex) {
          iVar8 = mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            iVar8 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[mfi.currentIndex];
          }
          uVar13 = 0;
          (**(code **)(*(long *)uVar4._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0
                      ))(local_290,
                         uVar4._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                         *(undefined8 *)(*(long *)((long)(pFVar5 + 1) + 0x18) + (long)iVar8 * 8),0,0
                         ,0,3);
          amrex::MFIter::operator++(&mfi);
        }
        amrex::MFIter::~MFIter(&mfi);
        if (have_divu != 0) {
          std::__cxx11::string::string((string *)&mfi,"divu",&local_291);
          bVar7 = amrex::AmrLevel::isStateVariable((string *)&mfi,&Divu_Type,&Divu);
          std::__cxx11::string::~string((string *)&mfi);
          if (!bVar7) {
            amrex::Error_host("Projection::initialVelocityProject(): Divu not found");
          }
          uVar13 = 0;
          this_00 = (NavierStokesBase *)
                    __dynamic_cast((this->LevelData).
                                   super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                   .
                                   super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar16],
                                   &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
          puVar6 = rhcc.
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar11 = NavierStokesBase::getDivCond(this_00,nghost,cur_divu_time);
          pMVar14 = puVar6[lVar16]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
          puVar6[lVar16]._M_t.
          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar11;
          if (pMVar14 != (MultiFab *)0x0) {
            (**(code **)(*(long *)&(pMVar14->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                        8))();
          }
        }
      }
      bVar7 = OutFlowBC::HasOutFlowBC(this->phys_bc);
      pMVar14 = (MultiFab *)CONCAT71((int7)((ulong)uVar13 >> 8),do_outflow_bcs != 0);
      uVar13 = extraout_RDX;
      lVar16 = lVar10;
      if ((have_divu != 0) && (bVar7 && do_outflow_bcs != 0)) {
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,&rhcc);
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type,&sig)
        ;
        pMVar14 = (MultiFab *)&vel;
        set_outflow_bcs(this,0x3ea,&phi,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar14,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type,
                        c_lev,f_lev,have_divu);
        std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                  ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type
                  );
        std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                  ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi);
        uVar13 = extraout_RDX_00;
      }
      for (; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
        scaleVar(this,sig.
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(int)uVar13,
                 pMVar14,(int)lVar16);
        uVar13 = extraout_RDX_01;
      }
      lVar16 = lVar10;
      if (have_divu == 0) {
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,&sig);
        local_218 = (pointer)0x0;
        local_238 = 0;
        _Divu_Type = (pointer)0x0;
        uStack_220 = (pointer)0x0;
        _Divu = 0;
        uStack_240 = 0;
        pMVar14 = (MultiFab *)&vel;
        doMLMGNodalProjection
                  (this,c_lev,local_284,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar14,&phi,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu,proj_tol,
                   proj_abs_tol,false,(MultiFab *)0x0,(MultiFab *)0x0,false);
      }
      else {
        for (; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
          amrex::MultiFab::mult
                    (rhcc.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,-1.0,0,1,nghost);
        }
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,&sig);
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type,&rhcc
                  );
        local_238 = 0;
        _Divu = 0;
        uStack_240 = 0;
        pMVar14 = (MultiFab *)&vel;
        doMLMGNodalProjection
                  (this,c_lev,local_284,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar14,&phi,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu,proj_tol,
                   proj_abs_tol,false,(MultiFab *)0x0,(MultiFab *)0x0,false);
      }
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&Divu_Type);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi);
      uVar13 = extraout_RDX_02;
      for (lVar16 = lVar10; lVar17 = lVar10, lVar16 <= lVar15; lVar16 = lVar16 + 1) {
        rescaleVar(this,sig.
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(int)uVar13,
                   pMVar14,(int)lVar16);
        uVar13 = extraout_RDX_03;
      }
      for (; lVar17 <= lVar15; lVar17 = lVar17 + 1) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar17]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1b0),0.0);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar17]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1a8),0.0);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar17]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x290),0.0);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar17]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x288),0.0);
      }
      if (verbose != 0) {
        poVar9 = amrex::OutStream();
        amrex::Print::Print((Print *)&mfi,poVar9);
        std::operator<<((ostream *)&mfi.tile_size,"After nodal projection:");
        std::endl<char,std::char_traits<char>>((ostream *)&mfi.tile_size);
        amrex::Print::~Print((Print *)&mfi);
        for (lVar16 = lVar10; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
          poVar9 = amrex::OutStream();
          amrex::Print::Print((Print *)&mfi,poVar9);
          pIVar1 = &mfi.tile_size;
          std::operator<<((ostream *)pIVar1,"  lev ");
          std::ostream::operator<<(pIVar1,(int)lVar16);
          std::operator<<((ostream *)pIVar1,": ");
          std::operator<<((ostream *)pIVar1,"max(abs(u,v,w)) = ");
          RVar19 = amrex::MultiFab::norm0
                             (vel.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar16],0,0,false,true);
          std::ostream::_M_insert<double>(RVar19);
          std::operator<<((ostream *)&mfi.tile_size," ");
          RVar19 = amrex::MultiFab::norm0
                             (vel.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar16],1,0,false,true);
          std::ostream::_M_insert<double>(RVar19);
          std::operator<<((ostream *)&mfi.tile_size," ");
          RVar19 = amrex::MultiFab::norm0
                             (vel.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar16],2,0,false,true);
          std::ostream::_M_insert<double>(RVar19);
          std::endl<char,std::char_traits<char>>((ostream *)&mfi.tile_size);
          amrex::Print::~Print((Print *)&mfi);
        }
      }
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::~vector(&rhcc.
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               );
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)((int)local_208._M_pi + 1);
    }
    if (verbose != 0) {
      local_290 = amrex::ParallelDescriptor::second();
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&mfi,poVar9);
      std::operator<<((ostream *)&mfi.tile_size,"Projection::initialVelocityProject(): time: ");
      std::ostream::_M_insert<double>(local_290 - dVar18);
      std::operator<<((ostream *)&mfi.tile_size,'\n');
      amrex::Print::~Print((Print *)&mfi);
    }
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::~vector(&sig.
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             );
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&phi);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&vel);
  }
  return;
}

Assistant:

void
Projection::initialVelocityProject (int  c_lev,
                                    Real cur_divu_time,
                                    int  have_divu,
                                    int init_vel_iter )
{
    int lev;
    int f_lev = parent->finestLevel();

    if ( init_vel_iter <= 0 ){
      // Make sure P_old is initialized
      for (lev = c_lev; lev <= f_lev; lev++)
      {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
      }
      
      if ( verbose ) Print()<<"Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n";
      return;
    }

    if (verbose)
    {
        amrex::Print() << "Projection::initialVelocityProject(): levels = " << c_lev
                       << "-" << f_lev << '\n';
        if (rho_wgt_vel_proj)
            amrex::Print() << "RHO WEIGHTED INITIAL VELOCITY PROJECTION\n";
        else
            amrex::Print() << "CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n";
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);
    Vector<std::unique_ptr<MultiFab> > sig(maxlev);

    for (int iter = 0; iter < init_vel_iter; ++iter)
    {
        if (verbose)
        {
            amrex::Print() << std::endl
                           << "Projection::initialVelocityProject(): iteration "
                           << iter
                           << std::endl;
        }

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.0);
        }

	// MLNodeLaplacian does not take any ghost cells from rhcc or sig.
	// copies only valid cells and fills ghosts internally.
	// However, vel and phi are assumed to have 1 ghost cell in MLMG.
	// set outflow bcs fills vel and phi using 1 ghost cell from sig (holding rho)
	// and rhcc (holding divu)
	const int nghost =
	  (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu) ? 1 : 0;

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
            phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));

            const BoxArray& grids  = LevelData[lev]->boxArray();
            const DistributionMapping& dmap = LevelData[lev]->DistributionMap();
            sig[lev].reset(new MultiFab(grids,dmap,1,nghost,MFInfo(),LevelData[lev]->Factory()));

            if (rho_wgt_vel_proj)
            {
	      if ( nghost > 0 ){
                LevelData[lev]->get_new_data(State_Type).setBndry(BogusValue,Density,1);

                AmrLevel& amr_level = parent->getLevel(lev);

                MultiFab& S_new = amr_level.get_new_data(State_Type);

                Real curr_time = amr_level.get_state_data(State_Type).curTime();

                for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
                {
                    amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,
                                                    Density,Density,1);
                }
	      }

	      MultiFab::Copy(*sig[lev],
			     LevelData[lev]->get_new_data(State_Type),
			     Density, 0, 1, nghost);
            }
            else
            {
                sig[lev]->setVal(1.,nghost);
            }
        }

        Vector<std::unique_ptr<MultiFab> > rhcc(maxlev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
            //
            // Set the physical boundary values.
            //
            AmrLevel& amr_level = parent->getLevel(lev);

            MultiFab& S_new = amr_level.get_new_data(State_Type);

            Real curr_time = amr_level.get_state_data(State_Type).curTime();

            for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
            }

            if (have_divu)
            {
                int Divu_Type, Divu;
                if (!LevelData[lev]->isStateVariable("divu", Divu_Type, Divu))
		  amrex::Error("Projection::initialVelocityProject(): Divu not found");

		NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev]);
		AMREX_ASSERT(!(ns == 0));

		rhcc[lev].reset(ns->getDivCond(nghost,cur_divu_time));
            }
        }

        if (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu)
        {
            set_outflow_bcs(INITIAL_VEL,phi,vel,
                            amrex::GetVecOfPtrs(rhcc),
                            amrex::GetVecOfPtrs(sig),
                            c_lev,f_lev,have_divu);
        }

        //
        // Scale the projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            scaleVar(sig[lev].get(),nghost,vel[lev],lev);
        }

        //
        // Project
        //
        //

        bool increment_gp = false;
        if (!have_divu)
        {
            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  {},
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }
        else
        {
            for (lev = c_lev; lev <= f_lev; lev++)
            {
                if (parent->Geom(0).IsRZ()) radMultScal(lev,*rhcc[lev]);
                rhcc[lev]->mult(-1.0,0,1,nghost);
            }

            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  amrex::GetVecOfPtrs(rhcc),
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }

        //
        // Unscale initial projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
            rescaleVar(sig[lev].get(),nghost,vel[lev],lev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_new_data(Press_Type).setVal(0.);

            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
            LevelData[lev]->get_new_data(Gradp_Type).setVal(0.);
        }

        if (verbose)
        {
            amrex::Print() << "After nodal projection:" << std::endl;
            for (lev = c_lev; lev <= f_lev; ++lev)
            {
                amrex::Print() << "  lev " << lev << ": "
#if (AMREX_SPACEDIM==3)
                               << "max(abs(u,v,w)) = "
#else
                               << "max(abs(u,v)) = "
#endif
                               << vel[lev]->norm0(0,0,false,true) << " "
                               << vel[lev]->norm0(1,0,false,true) << " "
#if (AMREX_SPACEDIM==3)
                               << vel[lev]->norm0(2,0,false,true)
#endif
                               << std::endl;
            }
        }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::initialVelocityProject(): time: " << run_time << '\n';
    }
}